

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seat.hpp
# Opt level: O2

void __thiscall
VIP::VIP(VIP *this,
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        *PriceMap)

{
  seat::seat(&this->super_seat,PriceMap);
  (this->super_seat)._vptr_seat = (_func_int **)&PTR_initName_00115c40;
  initName(this);
  seat::initPrice(&this->super_seat,&(this->super_seat).m_Name);
  return;
}

Assistant:

VIP(std::map<std::string, size_t> &PriceMap) : seat(PriceMap)
    {
        initName();
        initPrice(m_Name);
    }